

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_function(gravity_parser_t *parser,_Bool is_declaration,gtoken_t access_specifier,
                        gtoken_t storage_specifier)

{
  gravity_lexer_t *lexer_00;
  size_t sVar1;
  gtoken_s token_00;
  _Bool _Var2;
  gtoken_t gVar3;
  char *s1;
  gnode_r *pgVar4;
  gnode_t **ppgVar5;
  gnode_t *pgVar6;
  bool local_f1;
  size_t local_f0;
  gnode_t *local_e8;
  char *local_d0;
  _Bool is_inside_var_declaration;
  gnode_compound_stmt_t *compound;
  gnode_r *params;
  gnode_t *pgStack_a8;
  _Bool has_default_values;
  gnode_function_decl_t *func;
  char *pcStack_98;
  gtoken_t peek;
  char *identifier;
  gtoken_t local_64;
  undefined1 auStack_60 [4];
  gtoken_t type;
  gtoken_s token;
  _Bool is_implicit;
  gravity_lexer_t *lexer;
  gtoken_t storage_specifier_local;
  gtoken_t access_specifier_local;
  _Bool is_declaration_local;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  gVar3 = gravity_lexer_peek(lexer_00);
  token.value._7_1_ = gVar3 == TOK_OP_OPEN_CURLYBRACE;
  gravity_lexer_token((gtoken_s *)auStack_60,lexer_00);
  if ((token.value._7_1_ & 1) == 0) {
    local_64 = gravity_lexer_next(lexer_00);
    gravity_lexer_token((gtoken_s *)&identifier,lexer_00);
    memcpy(auStack_60,&identifier,0x28);
    if (local_64 != TOK_KEY_FUNC) {
      report_error(parser,GRAVITY_ERROR_SYNTAX,0x17589c);
      return (gnode_t *)0x0;
    }
  }
  pcStack_98 = (char *)0x0;
  if (is_declaration) {
    func._4_4_ = gravity_lexer_peek(lexer_00);
    _Var2 = token_isoperator(func._4_4_);
    if (_Var2) {
      gVar3 = gravity_lexer_next(lexer_00);
      s1 = token_name(gVar3);
      local_d0 = string_dup(s1);
    }
    else {
      local_d0 = parse_identifier(parser);
    }
    pcStack_98 = local_d0;
  }
  if (parser->declarations->n == 0) {
    local_e8 = (gnode_t *)0x0;
  }
  else {
    local_e8 = parser->declarations->p[parser->declarations->n - 1];
  }
  token_00.lineno = type;
  token_00.type = (gtoken_t)auStack_60;
  token_00.colno = token.type;
  token_00.position = token.lineno;
  token_00.bytes = token.colno;
  token_00.length = token.position;
  token_00.fileid = token.bytes;
  token_00.builtin = token.length;
  token_00.value = (char *)token._24_8_;
  pgStack_a8 = gnode_function_decl_create
                         (token_00,pcStack_98,access_specifier,storage_specifier,(gnode_r *)0x0,
                          (gnode_compound_stmt_t *)0x0,local_e8);
  if ((token.value._7_1_ & 1) == 0) {
    parse_required(parser,TOK_OP_OPEN_PARENTHESIS);
  }
  params._7_1_ = 0;
  pgVar4 = parse_optional_parameter_declaration
                     (parser,(_Bool)(token.value._7_1_ & 1),(_Bool *)((long)&params + 7));
  if ((token.value._7_1_ & 1) == 0) {
    parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
  }
  if (parser->declarations->n == parser->declarations->m) {
    if (parser->declarations->m == 0) {
      local_f0 = 8;
    }
    else {
      local_f0 = parser->declarations->m << 1;
    }
    parser->declarations->m = local_f0;
    ppgVar5 = (gnode_t **)realloc(parser->declarations->p,parser->declarations->m << 3);
    parser->declarations->p = ppgVar5;
  }
  ppgVar5 = parser->declarations->p;
  sVar1 = parser->declarations->n;
  parser->declarations->n = sVar1 + 1;
  ppgVar5[sVar1] = pgStack_a8;
  pgVar6 = parse_compound_statement(parser);
  parser->declarations->n = parser->declarations->n - 1;
  local_f1 = false;
  if ((parser->vdecl).n != 0) {
    local_f1 = (parser->vdecl).p[(parser->vdecl).n - 1] == 1;
  }
  *(bool *)((long)&pgStack_a8[1].token.value + 5) = local_f1;
  if (local_f1 == false) {
    parse_semicolon(parser);
  }
  *(byte *)((long)&pgStack_a8[1].token.value + 4) = params._7_1_ & 1;
  *(gnode_r **)&pgStack_a8[1].token.bytes = pgVar4;
  *(gnode_t **)&pgStack_a8[1].token.fileid = pgVar6;
  return pgStack_a8;
}

Assistant:

gnode_t *parse_function (gravity_parser_t *parser, bool is_declaration, gtoken_t access_specifier, gtoken_t storage_specifier) {
    DECLARE_LEXER;

    // access_specifier? storage_specifier? already parsed
    // 'function' IDENTIFIER '(' parameter_declaration_clause? ')' compound_statement

    // consume FUNC keyword (or peek for OPEN_CURLYBRACE)
    bool is_implicit = (gravity_lexer_peek(lexer) == TOK_OP_OPEN_CURLYBRACE);
    gtoken_s token = gravity_lexer_token(lexer);
    if (!is_implicit) {
        gtoken_t type = gravity_lexer_next(lexer);
        token = gravity_lexer_token(lexer);
        if (type != TOK_KEY_FUNC) {
            REPORT_ERROR(token, "Invalid function expression.");
            return NULL;
        }
    }

    // parse IDENTIFIER
    const char *identifier = NULL;
    if (is_declaration) {
        gtoken_t peek = gravity_lexer_peek(lexer);
        identifier = (token_isoperator(peek)) ? string_dup(token_name(gravity_lexer_next(lexer))) : parse_identifier(parser);
        DEBUG_PARSER("parse_function_declaration %s", identifier);
    }

    // create func declaration node
    gnode_function_decl_t *func = (gnode_function_decl_t *) gnode_function_decl_create(token, identifier, access_specifier, storage_specifier, NULL, NULL, LAST_DECLARATION());

    // check and consume TOK_OP_OPEN_PARENTHESIS
    if (!is_implicit) parse_required(parser, TOK_OP_OPEN_PARENTHESIS);

    // parse optional parameter declaration clause
    bool has_default_values = false;
    gnode_r *params = parse_optional_parameter_declaration(parser, is_implicit, &has_default_values);

    // check and consume TOK_OP_CLOSED_PARENTHESIS
    if (!is_implicit) parse_required(parser, TOK_OP_CLOSED_PARENTHESIS);

    // parse compound statement
    PUSH_DECLARATION(func);
    gnode_compound_stmt_t *compound = (gnode_compound_stmt_t*)parse_compound_statement(parser);
    POP_DECLARATION();

    // if func is declarared inside a variable declaration node then the semicolon check must be
    // performed once at variable declaration node level ad not inside the func node
    bool is_inside_var_declaration = ((marray_size(parser->vdecl) > 0) && (marray_last(parser->vdecl) == 1));
    func->is_closure = is_inside_var_declaration;
    
    // parse optional semicolon
    if (!is_inside_var_declaration) parse_semicolon(parser);

    // finish func setup
    func->has_defaults = has_default_values;
    func->params = params;
    func->block = compound;
    return (gnode_t *)func;
}